

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O2

void hexdump(char *title,uint8_t *p,size_t l)

{
  long lVar1;
  
  fprintf(_stderr,"%s (%zu bytes):\n",title,l);
  do {
    if (l == 0) {
      return;
    }
    fputs("   ",_stderr);
    lVar1 = 0;
    do {
      if ((int)lVar1 == 0x10) goto LAB_00128115;
      fprintf(_stderr," %02x",(ulong)p[lVar1]);
      lVar1 = lVar1 + 1;
      l = l - 1;
    } while (l != 0);
    l = 0;
LAB_00128115:
    p = p + lVar1;
    fputc(10,_stderr);
  } while( true );
}

Assistant:

static void hexdump(const char *title, const uint8_t *p, size_t l)
{
    fprintf(stderr, "%s (%zu bytes):\n", title, l);

    while (l != 0) {
        int i;
        fputs("   ", stderr);
        for (i = 0; i < 16; ++i) {
            fprintf(stderr, " %02x", *p++);
            if (--l == 0)
                break;
        }
        fputc('\n', stderr);
    }
}